

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O0

void __thiscall Teleport::SharedMemoryHandle::~SharedMemoryHandle(SharedMemoryHandle *this)

{
  SharedMemoryHandle *this_local;
  
  if (this->data != (SharedMemory *)0x0) {
    munmap(this->data,0x2b1240);
  }
  return;
}

Assistant:

~SharedMemoryHandle()
        {
#if UNITY_WIN

            UnmapViewOfFile(data);
            CloseHandle(hMapFile);

#else

            if (data)
            {
                munmap(data, sizeof(SharedMemory));
            }

#endif
        }